

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall fizplex::LPTest_AddAndEditColumn_Test::TestBody(LPTest_AddAndEditColumn_Test *this)

{
  Column *pCVar1;
  char *message;
  AssertHelper local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertionResult gtest_ar;
  LP lp;
  
  LP::LP(&lp);
  LP::add_column(&lp,Bounded,-1.0,2.0,0.0);
  pCVar1 = LP::column_header(&lp,0);
  pCVar1->upper = 3.14;
  pCVar1 = LP::column_header(&lp,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"3.14","lp.column_header(0u).upper",3.14,pCVar1->upper);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x3c,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LP::~LP(&lp);
  return;
}

Assistant:

TEST(LPTest, AddAndEditColumn) {
  LP lp;
  lp.add_column(ColType::Bounded, -1.0, 2.0);
  lp.column_header(0u).upper = 3.14;
  EXPECT_DOUBLE_EQ(3.14, lp.column_header(0u).upper);
}